

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O1

void __thiscall TrodesMsg::appendArg(TrodesMsg *this,char c,uint8_t a)

{
  string *psVar1;
  
  if (c == '1') {
    zmsg_addstrf(this->msg,"%u",(ulong)a);
    return;
  }
  psVar1 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar1,"Could not append to msg. Expected a different type, got uint8","");
  __cxa_throw(psVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::appendArg (const char c, const uint8_t a){
    if(c != '1') throw std::string(APPENDERROR "uint8");
    zmsg_addstrf (msg, "%" PRIu8, a);
}